

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.c
# Opt level: O2

void aom_highbd_subtract_block_c
               (int rows,int cols,int16_t *diff,ptrdiff_t diff_stride,uint8_t *src8,
               ptrdiff_t src_stride,uint8_t *pred8,ptrdiff_t pred_stride)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)src8 * 2;
  lVar1 = (long)pred8 * 2;
  uVar5 = 0;
  uVar3 = (ulong)(uint)cols;
  if (cols < 1) {
    uVar3 = uVar5;
  }
  if (rows < 1) {
    rows = 0;
  }
  for (; (int)uVar5 != rows; uVar5 = (ulong)((int)uVar5 + 1)) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      diff[uVar2] = *(short *)(lVar4 + uVar2 * 2) - *(short *)(lVar1 + uVar2 * 2);
    }
    diff = diff + diff_stride;
    lVar1 = lVar1 + pred_stride * 2;
    lVar4 = lVar4 + src_stride * 2;
  }
  return;
}

Assistant:

void aom_highbd_subtract_block_c(int rows, int cols, int16_t *diff,
                                 ptrdiff_t diff_stride, const uint8_t *src8,
                                 ptrdiff_t src_stride, const uint8_t *pred8,
                                 ptrdiff_t pred_stride) {
  int r, c;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);

  for (r = 0; r < rows; r++) {
    for (c = 0; c < cols; c++) {
      diff[c] = src[c] - pred[c];
    }

    diff += diff_stride;
    pred += pred_stride;
    src += src_stride;
  }
}